

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.cpp
# Opt level: O2

int __thiscall ncnn::Cast::forward(Cast *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int _packing;
  int _h;
  uint _c;
  short sVar1;
  void *pvVar2;
  void *pvVar3;
  int i;
  int iVar4;
  ulong uVar5;
  char cVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  size_t _elemsize;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  Mat local_70;
  
  iVar10 = this->type_to;
  if (this->type_from == iVar10) {
    Mat::operator=(top_blob,bottom_blob);
  }
  else {
    iVar4 = bottom_blob->dims;
    _packing = bottom_blob->packing;
    _elemsize = (size_t)_packing;
    if (iVar10 != 3) {
      if (iVar10 == 2) {
        _elemsize = (size_t)(_packing * 2);
      }
      else if (iVar10 == 1) {
        _elemsize = _elemsize * 4;
      }
      else {
        _elemsize = bottom_blob->elemsize;
      }
    }
    iVar10 = bottom_blob->w;
    _h = bottom_blob->h;
    _c = bottom_blob->c;
    if (iVar4 == 3) {
      Mat::create(top_blob,iVar10,_h,_c,_elemsize,_packing,opt->blob_allocator);
    }
    else if (iVar4 == 2) {
      Mat::create(top_blob,iVar10,_h,_elemsize,_packing,opt->blob_allocator);
    }
    else if (iVar4 == 1) {
      Mat::create(top_blob,iVar10,_elemsize,_packing,opt->blob_allocator);
    }
    if (top_blob->data == (void *)0x0) {
      return -100;
    }
    if ((long)top_blob->c * top_blob->cstep == 0) {
      return -100;
    }
    uVar14 = _h * iVar10 * _packing;
    iVar10 = this->type_from;
    iVar4 = this->type_to;
    if (iVar4 == 2 && iVar10 == 1) {
      uVar13 = 0;
      uVar12 = 0;
      if (0 < (int)uVar14) {
        uVar12 = (ulong)uVar14;
      }
      uVar8 = 0;
      if (0 < (int)_c) {
        uVar8 = _c;
      }
      for (; uVar13 != uVar8; uVar13 = uVar13 + 1) {
        Mat::channel(&local_70,bottom_blob,uVar13);
        pvVar2 = local_70.data;
        Mat::~Mat(&local_70);
        Mat::channel(&local_70,top_blob,uVar13);
        pvVar3 = local_70.data;
        Mat::~Mat(&local_70);
        for (uVar5 = 0; uVar12 != uVar5; uVar5 = uVar5 + 1) {
          uVar11 = *(uint *)((long)pvVar2 + uVar5 * 4);
          uVar9 = uVar11 & 0x7fffff;
          cVar6 = (char)(uVar11 >> 0x17);
          uVar7 = (ushort)(uVar11 >> 0x10);
          sVar1 = (short)uVar7 >> 0xf;
          if (cVar6 == -1) {
            uVar7 = sVar1 * -0x8000 + (ushort)(uVar9 != 0) * 0x200 + 0x7c00;
          }
          else {
            uVar11 = uVar11 >> 0x17 & 0xff;
            if (uVar11 == 0) {
LAB_00149b31:
              uVar7 = sVar1 * -0x8000;
            }
            else if (uVar11 < 0x8f) {
              if (uVar11 < 0x71) {
                if (uVar11 < 0x66) goto LAB_00149b31;
                uVar7 = sVar1 * -0x8000 | (ushort)((uVar9 | 0x800000) >> (0x7eU - cVar6 & 0x1f));
              }
              else {
                uVar7 = (ushort)(uVar9 >> 0xd) | sVar1 * -0x8000 | (uVar7 >> 7) * 0x400 + 0x4000;
              }
            }
            else {
              uVar7 = sVar1 * -0x8000 | 0x7c00;
            }
          }
          *(ushort *)((long)pvVar3 + uVar5 * 2) = uVar7;
        }
      }
      iVar10 = this->type_from;
      iVar4 = this->type_to;
    }
    if (iVar10 == 2) {
      if (iVar4 != 1) {
        return 0;
      }
      if ((int)uVar14 < 1) {
        uVar14 = 0;
      }
      if ((int)_c < 1) {
        _c = 0;
      }
      for (uVar13 = 0; uVar13 != _c; uVar13 = uVar13 + 1) {
        Mat::channel(&local_70,bottom_blob,uVar13);
        pvVar2 = local_70.data;
        Mat::~Mat(&local_70);
        Mat::channel(&local_70,top_blob,uVar13);
        pvVar3 = local_70.data;
        Mat::~Mat(&local_70);
        for (uVar12 = 0; uVar12 != uVar14; uVar12 = uVar12 + 1) {
          uVar7 = *(ushort *)((long)pvVar2 + uVar12 * 2);
          uVar8 = (uint)(uVar7 >> 0xf);
          uVar11 = uVar7 >> 10 & 0x1f;
          if (uVar11 == 0x1f) {
            uVar8 = (uint)uVar7 << 0xd | uVar8 << 0x1f | 0x7f800000;
          }
          else {
            uVar9 = uVar7 & 0x3ff;
            if ((uVar7 >> 10 & 0x1f) == 0) {
              if ((short)uVar9 == 0) {
                uVar8 = uVar8 << 0x1f;
              }
              else {
                iVar10 = 0;
                while (uVar11 = uVar9 >> 9, uVar9 = uVar9 * 2, (uVar11 & 1) == 0) {
                  iVar10 = iVar10 + 1;
                }
                uVar8 = (uVar9 & 0x3fe) << 0xd | iVar10 * -0x800000 + 0x38000000U | uVar8 << 0x1f;
              }
            }
            else {
              uVar8 = uVar9 * 0x2000 + (uVar11 << 0x17 | uVar8 << 0x1f) + 0x38000000;
            }
          }
          *(uint *)((long)pvVar3 + uVar12 * 4) = uVar8;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Cast::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    if (type_from == type_to)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int packing = bottom_blob.packing;

    size_t out_elemsize = elemsize;
    if (type_to == 1)
    {
        // float32
        out_elemsize = 4 * packing;
    }
    else if (type_to == 2)
    {
        // float16
        out_elemsize = 2 * packing;
    }
    else if (type_to == 3)
    {
        // int8
        out_elemsize = packing;
    }

    if (dims == 1)
    {
        top_blob.create(w, out_elemsize, packing, opt.blob_allocator);
    }
    else if (dims == 2)
    {
        top_blob.create(w, h, out_elemsize, packing, opt.blob_allocator);
    }
    else if (dims == 3)
    {
        top_blob.create(w, h, channels, out_elemsize, packing, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int size = w * h * packing;

    if (type_from == 1 && type_to == 2)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            unsigned short* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float32_to_float16(ptr[i]);
            }
        }
    }

    if (type_from == 2 && type_to == 1)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const unsigned short* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = float16_to_float32(ptr[i]);
            }
        }
    }

    // TODO more cast type

    return 0;
}